

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TryOptimizeInstrWithFixedDataProperty(GlobOpt *this,Instr **pInstr)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  Opnd *this_00;
  SymOpnd *this_01;
  Opnd *src1;
  Instr **instr;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  if (pInstr == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe74,"(pInstr)","pInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = IR::Instr::GetSrc1(*pInstr);
  if ((this_00 != (Opnd *)0x0) && (bVar2 = IR::Opnd::IsSymOpnd(this_00), bVar2)) {
    this_01 = IR::Opnd::AsSymOpnd(this_00);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (bVar2) goto LAB_005905ca;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0xe77,"(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())",
                     "src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_005905ca:
  sourceContextId = Func::GetSourceContextId((*pInstr)->m_func);
  functionId = Func::GetLocalFunctionId((*pInstr)->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,UseFixedDataPropsPhase,sourceContextId,functionId);
  if ((((!bVar2) && (bVar2 = IsLoopPrePass(this), !bVar2)) &&
      ((*(uint *)&this->field_0xf4 >> 5 & 1) == 0)) &&
     (bVar2 = OpCodeAttr::CanLoadFixedFields((*pInstr)->m_opcode), bVar2)) {
    IR::Instr::TryOptimizeInstrWithFixedDataProperty(*pInstr,pInstr,this);
  }
  return;
}

Assistant:

void
GlobOpt::TryOptimizeInstrWithFixedDataProperty(IR::Instr ** const pInstr)
{
    Assert(pInstr);
    IR::Instr * &instr = *pInstr;
    IR::Opnd * src1 = instr->GetSrc1();
    Assert(src1 && src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd());

    if(PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func))
    {
        return;
    }

    if (!this->IsLoopPrePass() && !this->isRecursiveCallOnLandingPad &&
        OpCodeAttr::CanLoadFixedFields(instr->m_opcode))
    {
        instr->TryOptimizeInstrWithFixedDataProperty(&instr, this);
    }
}